

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

LY_ERR lysp_type_enum_dup(ly_ctx *ctx,lysp_module *pmod,lysp_type_enum *orig_enm,lysp_type_enum *enm
                         )

{
  uint16_t *puVar1;
  lysp_ext_instance **pplVar2;
  lysp_qname *plVar3;
  lysp_qname *plVar4;
  lysp_ext_instance *plVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  long *plVar8;
  ulong uVar9;
  lysp_ext_instance *plVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  lysp_ext_instance *plVar14;
  lysp_ext_instance *plVar15;
  
  lydict_dup(ctx,orig_enm->name,&enm->name);
  lydict_dup(ctx,orig_enm->dsc,&enm->dsc);
  LVar6 = lydict_dup(ctx,orig_enm->ref,&enm->ref);
  enm->value = orig_enm->value;
  plVar3 = orig_enm->iffeatures;
  if (plVar3 != (lysp_qname *)0x0) {
    plVar4 = enm->iffeatures;
    if (plVar4 == (lysp_qname *)0x0) {
      plVar8 = (long *)calloc(1,*(long *)&plVar3[-1].flags * 0x18 + 8);
      if (plVar8 == (long *)0x0) goto LAB_0014fab1;
      lVar11 = 0;
    }
    else {
      plVar8 = (long *)realloc(&plVar4[-1].flags,
                               (*(long *)&plVar3[-1].flags + *(long *)&plVar4[-1].flags) * 0x18 + 8)
      ;
      if (plVar8 == (long *)0x0) goto LAB_0014fab1;
      lVar11 = *plVar8;
    }
    enm->iffeatures = (lysp_qname *)(plVar8 + 1);
    if (orig_enm->iffeatures == (lysp_qname *)0x0) {
      sVar12 = 0;
    }
    else {
      sVar12 = *(long *)&orig_enm->iffeatures[-1].flags * 0x18;
    }
    uVar13 = 0xffffffffffffffff;
    memset(plVar8 + lVar11 * 3 + 1,0,sVar12);
    lVar11 = 0;
    while( true ) {
      plVar3 = orig_enm->iffeatures;
      if (plVar3 == (lysp_qname *)0x0) {
        uVar9 = 0;
      }
      else {
        uVar9 = *(ulong *)&plVar3[-1].flags;
      }
      uVar13 = uVar13 + 1;
      if (uVar9 <= uVar13) break;
      plVar4 = enm->iffeatures;
      puVar1 = &plVar4[-1].flags;
      *(long *)puVar1 = *(long *)puVar1 + 1;
      LVar7 = lysp_qname_dup(ctx,(lysp_qname *)((long)&plVar3->str + lVar11),
                             (lysp_qname *)((long)&plVar4->str + lVar11));
      lVar11 = lVar11 + 0x18;
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
    }
  }
  plVar15 = orig_enm->exts;
  if (plVar15 != (lysp_ext_instance *)0x0) {
    plVar5 = enm->exts;
    if (plVar5 == (lysp_ext_instance *)0x0) {
      plVar8 = (long *)calloc(1,(long)plVar15[-1].exts * 0x70 | 8);
      if (plVar8 == (long *)0x0) goto LAB_0014fab1;
      lVar11 = 0;
      plVar14 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar14 = plVar5[-1].exts;
      plVar8 = (long *)realloc(&plVar5[-1].exts,
                               ((long)&plVar14->name + (long)&(plVar15[-1].exts)->name) * 0x70 | 8);
      if (plVar8 == (long *)0x0) {
LAB_0014fab1:
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_type_enum_dup");
        return LY_EMEM;
      }
      lVar11 = *plVar8;
    }
    enm->exts = (lysp_ext_instance *)(plVar8 + 1);
    if (orig_enm->exts == (lysp_ext_instance *)0x0) {
      sVar12 = 0;
    }
    else {
      sVar12 = (long)orig_enm->exts[-1].exts * 0x70;
    }
    memset(plVar8 + lVar11 * 0xe + 1,0,sVar12);
    plVar15 = (lysp_ext_instance *)0xffffffffffffffff;
    lVar11 = 0;
    while( true ) {
      plVar5 = orig_enm->exts;
      if (plVar5 == (lysp_ext_instance *)0x0) {
        plVar10 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar10 = plVar5[-1].exts;
      }
      plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
      if (plVar10 <= plVar15) break;
      plVar10 = enm->exts;
      pplVar2 = &plVar10[-1].exts;
      *pplVar2 = (lysp_ext_instance *)((long)&(*pplVar2)->name + 1);
      LVar7 = lysp_ext_dup(ctx,pmod,enm,LY_STMT_ENUM,
                           (lysp_ext_instance *)((long)&plVar5->name + lVar11),
                           (lysp_ext_instance *)((long)&plVar10[(long)plVar14].name + lVar11));
      lVar11 = lVar11 + 0x70;
      if (LVar7 != LY_SUCCESS) {
        return LVar7;
      }
    }
  }
  enm->flags = orig_enm->flags;
  return LVar6;
}

Assistant:

static LY_ERR
lysp_type_enum_dup(const struct ly_ctx *ctx, const struct lysp_module *pmod, const struct lysp_type_enum *orig_enm,
        struct lysp_type_enum *enm)
{
    LY_ERR ret = LY_SUCCESS;

    DUP_STRING(ctx, orig_enm->name, enm->name, ret);
    DUP_STRING(ctx, orig_enm->dsc, enm->dsc, ret);
    DUP_STRING(ctx, orig_enm->ref, enm->ref, ret);
    enm->value = orig_enm->value;
    DUP_ARRAY(ctx, orig_enm->iffeatures, enm->iffeatures, lysp_qname_dup);
    DUP_EXTS(ctx, pmod, enm, LY_STMT_ENUM, orig_enm->exts, enm->exts, lysp_ext_dup);
    enm->flags = orig_enm->flags;

    return ret;
}